

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool __thiscall
Assimp::PLY::DOM::ParseElementInstanceListsBinary
          (DOM *this,IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
          char **pCur,uint *bufferSize,PLYImporter *loader,bool p_bBE)

{
  bool bVar1;
  Logger *pLVar2;
  size_type __new_size;
  reference pEVar3;
  reference pEVar4;
  __normal_iterator<Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
  local_60;
  __normal_iterator<Assimp::PLY::ElementInstanceList_*,_std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>_>
  local_58;
  iterator a;
  __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
  local_48;
  const_iterator i;
  bool p_bBE_local;
  PLYImporter *loader_local;
  uint *bufferSize_local;
  char **pCur_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *streamBuffer_local;
  DOM *this_local;
  
  i._M_current._7_1_ = p_bBE;
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"PLY::DOM::ParseElementInstanceListsBinary() begin");
  __new_size = std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::size
                         (&this->alElements);
  std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>::
  resize(&this->alElementData,__new_size);
  a._M_current = (ElementInstanceList *)
                 std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::begin
                           (&this->alElements);
  __gnu_cxx::
  __normal_iterator<Assimp::PLY::Element_const*,std::vector<Assimp::PLY::Element,std::allocator<Assimp::PLY::Element>>>
  ::__normal_iterator<Assimp::PLY::Element*>
            ((__normal_iterator<Assimp::PLY::Element_const*,std::vector<Assimp::PLY::Element,std::allocator<Assimp::PLY::Element>>>
              *)&local_48,
             (__normal_iterator<Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
              *)&a);
  local_58._M_current =
       (ElementInstanceList *)
       std::
       vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>::
       begin(&this->alElementData);
  do {
    local_60._M_current =
         (Element *)
         std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::end
                   (&this->alElements);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_60);
    if (!bVar1) {
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"PLY::DOM::ParseElementInstanceListsBinary() succeeded");
      return true;
    }
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
             ::operator*(&local_48);
    if (pEVar3->eSemantic == EEST_Vertex) {
LAB_00715432:
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_48);
      ElementInstanceList::ParseInstanceListBinary
                (streamBuffer,buffer,pCur,bufferSize,pEVar3,(ElementInstanceList *)0x0,loader,
                 (bool)(i._M_current._7_1_ & 1));
    }
    else {
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_48);
      if (pEVar3->eSemantic == EEST_Face) goto LAB_00715432;
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_48);
      if (pEVar3->eSemantic == EEST_TriStrip) goto LAB_00715432;
      pEVar4 = __gnu_cxx::
               __normal_iterator<Assimp::PLY::ElementInstanceList_*,_std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>_>
               ::operator*(&local_58);
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_48);
      std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>::
      resize(&pEVar4->alInstances,(ulong)pEVar3->NumOccur);
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
               ::operator*(&local_48);
      pEVar4 = __gnu_cxx::
               __normal_iterator<Assimp::PLY::ElementInstanceList_*,_std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>_>
               ::operator*(&local_58);
      ElementInstanceList::ParseInstanceListBinary
                (streamBuffer,buffer,pCur,bufferSize,pEVar3,pEVar4,(PLYImporter *)0x0,
                 (bool)(i._M_current._7_1_ & 1));
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::PLY::Element_*,_std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>_>
    ::operator++(&local_48);
    __gnu_cxx::
    __normal_iterator<Assimp::PLY::ElementInstanceList_*,_std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

bool PLY::DOM::ParseElementInstanceListsBinary(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer,
    const char* &pCur,
    unsigned int &bufferSize,
    PLYImporter* loader,
    bool p_bBE)
{
    ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceListsBinary() begin");
  alElementData.resize(alElements.size());

  std::vector<PLY::Element>::const_iterator i = alElements.begin();
  std::vector<PLY::ElementInstanceList>::iterator a = alElementData.begin();

  // parse all element instances
  for (; i != alElements.end(); ++i, ++a)
  {
    if ((*i).eSemantic == EEST_Vertex || (*i).eSemantic == EEST_Face || (*i).eSemantic == EEST_TriStrip)
    {
      PLY::ElementInstanceList::ParseInstanceListBinary(streamBuffer, buffer, pCur, bufferSize, &(*i), NULL, loader, p_bBE);
    }
    else
    {
      (*a).alInstances.resize((*i).NumOccur);
      PLY::ElementInstanceList::ParseInstanceListBinary(streamBuffer, buffer, pCur, bufferSize, &(*i), &(*a), NULL, p_bBE);
    }
  }

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceListsBinary() succeeded");
  return true;
}